

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall Fossilize::FeatureFilter::Impl::pnext_chain_is_supported(Impl *this,void *pNext)

{
  VkImageAspectFlags *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  VkBool32 VVar4;
  uint uVar5;
  DeviceQueryInterface *pDVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  uint uVar10;
  const_iterator cVar11;
  byte bVar12;
  char *pcVar13;
  uint uVar14;
  int *piVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  VkBaseInStructure *base;
  bool bVar22;
  bool bVar23;
  VkPhysicalDeviceImageRobustnessFeaturesEXT robust_image;
  VkPhysicalDeviceFeatures2 pdf2;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  key_type local_160 [7];
  key_type local_70;
  key_type local_50;
  
  paVar2 = &local_160[0].field_2;
  do {
    piVar15 = (int *)pNext;
    if (piVar15 == (int *)0x0) break;
    iVar3 = *piVar15;
    pNext = piVar15;
    if (iVar3 < 0x3b9e3cd0) {
      if (iVar3 < 0x3b9cf898) {
        if (0x3b9c5488 < iVar3) {
          if (iVar3 < 0x3b9c9309) {
            if (iVar3 == 0x3b9c5489) {
              pcVar16 = "VK_EXT_conservative_rasterization";
              pcVar13 = "";
LAB_0017c489:
              local_160[0]._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_160,pcVar16,pcVar13);
              cVar11 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)this,local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160[0]._M_dataplus._M_p != paVar2) {
                operator_delete(local_160[0]._M_dataplus._M_p,
                                local_160[0].field_2._M_allocated_capacity + 1);
              }
              if (cVar11.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur == (__node_type *)0x0) goto LAB_0017ca7a;
            }
            else {
              if (iVar3 != 0x3b9c5871) goto LAB_0017ca70;
              if (piVar15[5] != 0) {
                VVar4 = (this->features).depth_clip.depthClipEnable;
                goto joined_r0x0017c336;
              }
            }
          }
          else if (iVar3 == 0x3b9c9309) {
            local_160[0]._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_160,"VK_KHR_maintenance2","");
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)this,local_160);
            if (cVar11.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              uVar10 = this->api_version;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160[0]._M_dataplus._M_p != paVar2) {
                operator_delete(local_160[0]._M_dataplus._M_p,
                                local_160[0].field_2._M_allocated_capacity + 1);
              }
              if (uVar10 < 0x401000) goto LAB_0017ca7a;
            }
            else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_160[0]._M_dataplus._M_p != paVar2) {
              operator_delete(local_160[0]._M_dataplus._M_p,
                              local_160[0].field_2._M_allocated_capacity + 1);
            }
            bVar7 = piVar15[4] != 0;
            if (bVar7) {
              bVar22 = aspect_mask_is_supported
                                 (this,*(VkImageAspectFlags *)(*(long *)(piVar15 + 6) + 8));
              if (bVar22) {
                lVar21 = 0x14;
                uVar20 = 0;
                do {
                  uVar20 = uVar20 + 1;
                  bVar7 = uVar20 < (uint)piVar15[4];
                  if (!bVar7) goto LAB_0017caac;
                  pVVar1 = (VkImageAspectFlags *)(*(long *)(piVar15 + 6) + lVar21);
                  lVar21 = lVar21 + 0xc;
                  bVar22 = aspect_mask_is_supported(this,*pVVar1);
                } while (bVar22);
              }
LAB_0017ca33:
              if (bVar7) goto LAB_0017ca7a;
            }
          }
          else if (iVar3 == 0x3b9c930b) {
            local_160[0]._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_160,"VK_KHR_maintenance2","");
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)this,local_160);
            if (cVar11.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              uVar10 = this->api_version;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160[0]._M_dataplus._M_p != paVar2) {
                operator_delete(local_160[0]._M_dataplus._M_p,
                                local_160[0].field_2._M_allocated_capacity + 1);
              }
              if (uVar10 < 0x401000) goto LAB_0017ca7a;
            }
            else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_160[0]._M_dataplus._M_p != paVar2) {
              operator_delete(local_160[0]._M_dataplus._M_p,
                              local_160[0].field_2._M_allocated_capacity + 1);
            }
          }
          else {
            if (iVar3 != 0x3b9cc5d1) goto LAB_0017ca70;
            local_160[0]._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_160,"VK_EXT_sampler_filter_minmax","");
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)this,local_160);
            if (cVar11.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              VVar4 = (this->features).vk12.samplerFilterMinmax;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160[0]._M_dataplus._M_p != paVar2) {
                operator_delete(local_160[0]._M_dataplus._M_p,
                                local_160[0].field_2._M_allocated_capacity + 1);
              }
              if (VVar4 == 0) goto LAB_0017ca7a;
            }
            else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_160[0]._M_dataplus._M_p != paVar2) {
              operator_delete(local_160[0]._M_dataplus._M_p,
                              local_160[0].field_2._M_allocated_capacity + 1);
            }
            if (2 < (uint)piVar15[4]) goto LAB_0017ca7a;
          }
          goto LAB_0017caac;
        }
        if (iVar3 < 0x3b9b9908) {
          if (iVar3 == 0x3b9b3762) {
            VVar4 = (this->features).transform_feedback.geometryStreams;
            goto joined_r0x0017c336;
          }
          if (iVar3 != 0x3b9b75e2) goto LAB_0017ca70;
          if ((this->features).dynamic_rendering.dynamicRendering != 0) {
            bVar7 = piVar15[5] != 0;
            if (bVar7) {
              uVar20 = 0;
              do {
                iVar3 = *(int *)(*(long *)(piVar15 + 6) + uVar20 * 4);
                if (((iVar3 != 0) && (pDVar6 = this->query, pDVar6 != (DeviceQueryInterface *)0x0))
                   && (cVar8 = (**(code **)(*(long *)pDVar6 + 0x10))(pDVar6,iVar3,0x80),
                      cVar8 == '\0')) {
                  if (bVar7) goto LAB_0017ca7a;
                  break;
                }
                uVar20 = uVar20 + 1;
                bVar7 = uVar20 < (uint)piVar15[5];
              } while (bVar7);
            }
            if ((((piVar15[8] == 0) || (pDVar6 = this->query, pDVar6 == (DeviceQueryInterface *)0x0)
                 ) || (cVar8 = (**(code **)(*(long *)pDVar6 + 0x10))(pDVar6,piVar15[8],0x200),
                      cVar8 != '\0')) &&
               ((((piVar15[9] == 0 || (pDVar6 = this->query, pDVar6 == (DeviceQueryInterface *)0x0))
                 || (cVar8 = (**(code **)(*(long *)pDVar6 + 0x10))(pDVar6,piVar15[9],0x200),
                    cVar8 != '\0')) &&
                ((piVar15[8] == 0 || (piVar15[9] == 0 || piVar15[8] == piVar15[9])))))) {
              if (piVar15[4] != 0) {
                uVar10 = (this->props).multiview.maxMultiviewViewCount;
                bVar7 = false;
                uVar14 = -1 << ((byte)uVar10 & 0x1f);
                if (0x1f < uVar10) {
                  uVar14 = 0;
                }
                if ((uVar14 & piVar15[4]) != 0) goto LAB_0017cab3;
              }
              goto LAB_0017caac;
            }
          }
        }
        else {
          if (iVar3 != 0x3b9b9908) {
            if (iVar3 != 0x3b9bd3a0) {
              if (iVar3 == 0x3b9c4cb9) {
                pcVar16 = "VK_EXT_discard_rectangles";
                pcVar13 = "";
                goto LAB_0017c489;
              }
              goto LAB_0017ca70;
            }
            local_160[0]._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_160,"VK_EXT_pipeline_robustness","");
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)this,local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160[0]._M_dataplus._M_p != paVar2) {
              operator_delete(local_160[0]._M_dataplus._M_p,
                              local_160[0].field_2._M_allocated_capacity + 1);
            }
            if (((cVar11.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur == (__node_type *)0x0) ||
                ((((piVar15[4] != 0 || (piVar15[7] != 0)) ||
                  ((piVar15[5] != 0 || (piVar15[6] != 0)))) &&
                 ((this->features).pipeline_robustness.pipelineRobustness == 0)))) ||
               (pDVar6 = this->query, pDVar6 == (DeviceQueryInterface *)0x0)) goto LAB_0017ca7a;
            bVar7 = true;
            if ((piVar15[4] != 3) && (piVar15[6] != 3)) {
              bVar7 = piVar15[5] == 3;
            }
            if (piVar15[7] == 3) {
              memset(local_160,0,0xf0);
              local_160[0]._M_dataplus._M_p._0_4_ = 0x3b9bb078;
              local_178 = 0;
              uStack_170 = 0;
              local_188 = 0x3b9f2730;
              uStack_184 = 0;
              uStack_180 = 0;
              uStack_17c = 0;
              local_160[0]._M_string_length = (size_type)&local_188;
              (**(code **)(*(long *)this->query + 0x20))();
              iVar3 = local_178._4_4_;
joined_r0x0017c109:
              if (iVar3 == 0) goto LAB_0017c810;
            }
            else if (piVar15[7] == 2) {
              memset(local_160,0,0xf0);
              local_160[0]._M_dataplus._M_p._0_4_ = 0x3b9bb078;
              local_178 = 0;
              local_188 = 0x3b9fe698;
              uStack_184 = 0;
              uStack_180 = 0;
              uStack_17c = 0;
              local_160[0]._M_string_length = (size_type)&local_188;
              (**(code **)(*(long *)pDVar6 + 0x20))(pDVar6);
              iVar3 = (VkBool32)local_178;
              goto joined_r0x0017c109;
            }
            if (bVar7) {
              memset(local_160,0,0xf0);
              local_160[0]._M_dataplus._M_p._0_4_ = 0x3b9bb078;
              local_178 = 0;
              uStack_170 = 0;
              local_188 = 0x3b9f2730;
              uStack_184 = 0;
              uStack_180 = 0;
              uStack_17c = 0;
              local_160[0]._M_string_length = (size_type)&local_188;
              (**(code **)(*(long *)this->query + 0x20))(this->query,local_160);
              VVar4 = (VkBool32)local_178;
              goto joined_r0x0017c336;
            }
            goto LAB_0017caac;
          }
          if ((this->features).multiview.multiview != 0) {
            uVar20 = (ulong)(uint)piVar15[4];
            bVar7 = uVar20 != 0;
            if (bVar7) {
              uVar10 = (this->props).multiview.maxMultiviewViewCount;
              uVar14 = -1 << ((byte)uVar10 & 0x1f);
              if (0x1f < uVar10) {
                uVar14 = 0;
              }
              if ((**(uint **)(piVar15 + 6) & uVar14) == 0) {
                uVar17 = 0;
                do {
                  if (uVar20 - 1 == uVar17) goto LAB_0017c40c;
                  uVar18 = uVar17 + 1;
                  lVar21 = uVar17 + 1;
                  uVar17 = uVar18;
                } while (((*(uint **)(piVar15 + 6))[lVar21] & uVar14) == 0);
                bVar7 = uVar18 < uVar20;
              }
              if (bVar7) goto LAB_0017ca7a;
            }
LAB_0017c40c:
            uVar20 = (ulong)(uint)piVar15[0xc];
            bVar7 = uVar20 == 0;
            if (!bVar7) {
              uVar10 = (this->props).multiview.maxMultiviewViewCount;
              uVar14 = -1 << ((byte)uVar10 & 0x1f);
              if (0x1f < uVar10) {
                uVar14 = 0;
              }
              if ((**(uint **)(piVar15 + 0xe) & uVar14) == 0) {
                uVar17 = 0;
                do {
                  if (uVar20 - 1 == uVar17) goto LAB_0017caac;
                  uVar18 = uVar17 + 1;
                  lVar21 = uVar17 + 1;
                  uVar17 = uVar18;
                } while (((*(uint **)(piVar15 + 0xe))[lVar21] & uVar14) == 0);
                bVar7 = uVar20 <= uVar18;
              }
              if (!bVar7) goto LAB_0017ca7a;
            }
            goto LAB_0017caac;
          }
        }
LAB_0017ca7a:
        bVar7 = false;
      }
      else {
        if (iVar3 < 0x3b9d3ee8) {
          if (iVar3 < 0x3b9d2b60) {
            if (iVar3 == 0x3b9cf898) {
              pcVar16 = "VK_EXT_sample_locations";
              pcVar13 = "";
              goto LAB_0017c489;
            }
            if (iVar3 == 0x3b9cf89a) {
              local_160[0]._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_160,"VK_EXT_sample_locations","");
              cVar11 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)this,local_160);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160[0]._M_dataplus._M_p != paVar2) {
                operator_delete(local_160[0]._M_dataplus._M_p,
                                local_160[0].field_2._M_allocated_capacity + 1);
              }
              if (cVar11.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur != (__node_type *)0x0) {
                if ((piVar15[4] == 0) || (piVar15[0xd] == 0)) goto LAB_0017caac;
                if (((uint)piVar15[0xb] <=
                     (this->props).sample_locations.maxSampleLocationGridSize.width) &&
                   ((uint)piVar15[0xc] <=
                    (this->props).sample_locations.maxSampleLocationGridSize.height)) {
                  VVar4 = (this->props).sample_locations.sampleLocationSampleCounts & piVar15[10];
                  goto joined_r0x0017c336;
                }
              }
              goto LAB_0017ca7a;
            }
            if (iVar3 == 0x3b9d0c22) {
              VVar4 = (this->features).blend_operation_advanced.advancedBlendCoherentOperations;
              goto joined_r0x0017c336;
            }
          }
          else if (iVar3 + 0xc462d4a0U < 2) {
            VVar4 = (this->features).ycbcr_conversion.samplerYcbcrConversion;
            goto joined_r0x0017c336;
          }
          goto LAB_0017ca70;
        }
        if (iVar3 < 0x3b9dd359) {
          if (iVar3 == 0x3b9d3ee8) {
            if ((ulong)(uint)piVar15[4] == 0) {
              uVar10 = 0;
            }
            else {
              uVar20 = 0;
              uVar10 = 0;
              do {
                uVar10 = uVar10 | *(uint *)(*(long *)(piVar15 + 6) + uVar20 * 4);
                uVar20 = uVar20 + 1;
              } while ((uint)piVar15[4] != uVar20);
            }
            if ((((uVar10 & 2) == 0) ||
                ((this->features).descriptor_indexing.descriptorBindingUpdateUnusedWhilePending != 0
                )) && (((uVar10 & 4) == 0 ||
                       ((this->features).descriptor_indexing.descriptorBindingPartiallyBound != 0)))
               ) {
              if ((uVar10 & 8) == 0) goto LAB_0017caac;
              VVar4 = (this->features).descriptor_indexing.descriptorBindingVariableDescriptorCount;
              goto joined_r0x0017c336;
            }
          }
          else {
            if (iVar3 != 0x3b9db031) goto LAB_0017ca70;
            local_160[0]._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_160,"VK_EXT_vertex_attribute_divisor","");
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)this,local_160);
            if (cVar11.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"VK_KHR_vertex_attribute_divisor","");
              cVar11 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)this,&local_50);
              bVar22 = cVar11.
                       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ._M_cur == (__node_type *)0x0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              bVar22 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160[0]._M_dataplus._M_p != paVar2) {
              operator_delete(local_160[0]._M_dataplus._M_p,
                              local_160[0].field_2._M_allocated_capacity + 1);
            }
            uVar10 = 0;
            bVar7 = false;
            if (bVar22) goto LAB_0017cab3;
            if ((ulong)(uint)piVar15[4] == 0) {
              bVar9 = 0;
              bVar12 = 0;
            }
            else {
              uVar20 = 0;
              bVar12 = 0;
              bVar9 = 0;
              uVar10 = 0;
              do {
                uVar14 = *(uint *)(*(long *)(piVar15 + 6) + 4 + uVar20 * 8);
                if (uVar14 != 1) {
                  bVar9 = 1;
                }
                if (uVar14 == 0) {
                  bVar12 = 1;
                }
                if (uVar14 < uVar10) {
                  uVar14 = uVar10;
                }
                uVar10 = uVar14;
                uVar20 = uVar20 + 1;
              } while ((uint)piVar15[4] != uVar20);
            }
            if (((uVar10 <= (this->props).attribute_divisor.maxVertexAttribDivisor) &&
                (!(bool)(bVar12 & (this->features).attribute_divisor.
                                  vertexAttributeInstanceRateZeroDivisor == 0))) &&
               (!(bool)(bVar9 & (this->features).attribute_divisor.
                                vertexAttributeInstanceRateDivisor == 0))) goto LAB_0017caac;
          }
          goto LAB_0017ca7a;
        }
        if (iVar3 == 0x3b9dd359) {
          if (this->api_version < 0x402000) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"VK_KHR_depth_stencil_resolve","");
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)this,&local_70);
            bVar7 = cVar11.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur == (__node_type *)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar7 = false;
          }
          if (bVar7) goto LAB_0017ca7a;
          if (*(VkAttachmentReference2 **)(piVar15 + 6) != (VkAttachmentReference2 *)0x0) {
            bVar7 = attachment_reference2_is_supported
                              (this,*(VkAttachmentReference2 **)(piVar15 + 6));
            if (!bVar7) goto LAB_0017c810;
            uVar10 = piVar15[4];
            if (((uVar10 != 0) &&
                (((this->props).ds_resolve.supportedDepthResolveModes & uVar10) == 0)) ||
               ((uVar14 = piVar15[5], uVar14 != 0 &&
                (((this->props).ds_resolve.supportedStencilResolveModes & uVar14) == 0))))
            goto LAB_0017ca7a;
            if (uVar10 == uVar14) {
              if (uVar10 == 0x10 || uVar14 == 0x10) goto LAB_0017ca7a;
            }
            else {
              uVar20 = (ulong)(uVar14 != 0) << 2 | 0x11e8;
              if (uVar10 == 0) {
                uVar20 = 0x11e8;
              }
              bVar7 = false;
              if ((uVar14 == 0x10) || (uVar10 == 0x10)) goto LAB_0017ca7a;
              if (*(int *)((this->props2).properties.deviceName + (uVar20 - 0x6c)) == 0)
              goto LAB_0017cab3;
            }
          }
        }
        else {
          if (iVar3 == 0x3b9e1d92) {
            VVar4 = (this->features).fragment_density.fragmentDensityMap;
            goto joined_r0x0017c336;
          }
          if (iVar3 != 0x3b9e38e9) goto LAB_0017ca70;
        }
LAB_0017caac:
        bVar7 = true;
        pNext = *(int **)(piVar15 + 2);
      }
    }
    else {
      if (0x3b9f948f < iVar3) {
        if (iVar3 < 0x3ba09a49) {
          if (iVar3 < 0x3ba0251a) {
            if (iVar3 == 0x3b9f9490) {
              VVar4 = (this->features).synchronization2.synchronization2;
            }
            else {
              if (iVar3 != 0x3b9fac02) goto LAB_0017ca70;
LAB_0017be2c:
              VVar4 = (this->features).graphics_pipeline_library.graphicsPipelineLibrary;
            }
          }
          else {
            if (iVar3 == 0x3ba0251a) {
              if ((this->features).mutable_descriptor_type.mutableDescriptorType != 0) {
                uVar20 = (ulong)(uint)piVar15[4];
                bVar7 = uVar20 != 0;
                if (bVar7) {
                  uVar17 = 0;
                  do {
                    uVar18 = (ulong)*(uint *)(*(long *)(piVar15 + 6) + uVar17 * 0x10);
                    bVar22 = uVar18 != 0;
                    if (bVar22) {
                      uVar19 = 1;
                      do {
                        iVar3 = *(int *)(*(long *)(uVar17 * 0x10 + *(long *)(piVar15 + 6) + 8) + -4
                                        + uVar19 * 4);
                        if ((5 < iVar3 - 2U) && (iVar3 != 0)) {
                          if (bVar22) goto LAB_0017ca33;
                          break;
                        }
                        bVar22 = uVar19 < uVar18;
                        bVar23 = uVar19 != uVar18;
                        uVar19 = uVar19 + 1;
                      } while (bVar23);
                    }
                    uVar17 = uVar17 + 1;
                    bVar7 = uVar17 < uVar20;
                  } while (uVar17 != uVar20);
                }
                goto LAB_0017caac;
              }
              goto LAB_0017ca7a;
            }
            if (iVar3 == 0x3ba034b9) {
              VVar4 = (this->features).depth_clip_control.depthClipControl;
            }
            else {
              if (iVar3 != 0x3ba086c2) goto LAB_0017ca70;
              VVar4 = (this->features).multisampled_render_to_single_sampled.
                      multisampledRenderToSingleSampled;
            }
          }
        }
        else if (iVar3 < 0x3ba1c711) {
          if (iVar3 == 0x3ba09a49) {
            VVar4 = (this->features).color_write_enable.colorWriteEnable;
          }
          else {
            if (iVar3 != 0x3ba10f79) goto LAB_0017ca70;
            VVar4 = (this->features).border_color_swizzle.borderColorSwizzle;
          }
        }
        else if (iVar3 == 0x3ba1c711) {
          VVar4 = (this->features).subpass_merge_feedback.subpassMergeFeedback;
        }
        else if (iVar3 == 0x3ba1f5f5) {
          VVar4 = (this->features).maintenance5.maintenance5;
        }
        else {
          if (iVar3 != 0x3ba3ab71) goto LAB_0017ca70;
          VVar4 = (this->features).depth_clamp_control.depthClampControl;
        }
        goto joined_r0x0017c336;
      }
      if (0x3b9eaa30 < iVar3) {
        if (iVar3 < 0x3b9f1b7a) {
          if (iVar3 == 0x3b9eaa31) {
            local_160[0]._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_160,"VK_EXT_provoking_vertex","");
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)this,local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160[0]._M_dataplus._M_p != paVar2) {
              operator_delete(local_160[0]._M_dataplus._M_p,
                              local_160[0].field_2._M_allocated_capacity + 1);
            }
            if (cVar11.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              if (piVar15[4] == 1) {
                VVar4 = (this->features).provoking_vertex.provokingVertexLast;
                goto joined_r0x0017c336;
              }
              goto LAB_0017caac;
            }
          }
          else {
            if (iVar3 != 0x3b9ebdb9) goto LAB_0017ca70;
            iVar3 = piVar15[4];
            if ((((iVar3 != 1) || ((this->features).line_rasterization.rectangularLines != 0)) &&
                ((iVar3 != 2 || ((this->features).line_rasterization.bresenhamLines != 0)))) &&
               ((iVar3 != 3 || ((this->features).line_rasterization.smoothLines != 0)))) {
              if (piVar15[5] == 1) {
                if (((iVar3 == 1) &&
                    ((this->features).line_rasterization.stippledRectangularLines == 0)) ||
                   ((iVar3 == 2 && ((this->features).line_rasterization.stippledBresenhamLines == 0)
                    ))) goto LAB_0017ca7a;
                if (iVar3 == 3) {
                  VVar4 = (this->features).line_rasterization.stippledSmoothLines;
                  goto joined_r0x0017c336;
                }
              }
              goto LAB_0017caac;
            }
          }
        }
        else if (iVar3 == 0x3b9f1b7a) {
          local_160[0]._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_160,"VK_EXT_depth_bias_control","");
          cVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)this,local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160[0]._M_dataplus._M_p != paVar2) {
            operator_delete(local_160[0]._M_dataplus._M_p,
                            local_160[0].field_2._M_allocated_capacity + 1);
          }
          if ((cVar11.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur != (__node_type *)0x0) &&
             ((piVar15[4] != 1 ||
              ((this->features).depth_bias_control.leastRepresentableValueForceUnormRepresentation
               != 0)))) {
            if (piVar15[4] == 2) {
              VVar4 = (this->features).depth_bias_control.floatRepresentation;
              goto joined_r0x0017c336;
            }
            goto LAB_0017caac;
          }
        }
        else if (iVar3 == 0x3b9f2b18) {
          local_160[0]._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_160,"VK_EXT_custom_border_color","");
          cVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)this,local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160[0]._M_dataplus._M_p != paVar2) {
            operator_delete(local_160[0]._M_dataplus._M_p,
                            local_160[0].field_2._M_allocated_capacity + 1);
          }
          if ((cVar11.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur != (__node_type *)0x0) &&
             ((this->features).custom_border_color.customBorderColorWithoutFormat != 0 ||
              piVar15[8] != 0)) goto LAB_0017caac;
        }
        else {
          if (iVar3 == 0x3b9f36d0) goto LAB_0017be2c;
LAB_0017ca70:
          pnext_chain_is_supported();
        }
        goto LAB_0017ca7a;
      }
      if (0x3b9e5440 < iVar3) {
        if (1 < iVar3 + 0xc461abbfU) {
          if (iVar3 == 0x3b9e7769) {
            if (((this->features).separate_ds_layout.separateDepthStencilLayouts != 0) &&
               (bVar7 = image_layout_is_supported(this,piVar15[4]), bVar7)) goto LAB_0017caac;
          }
          else {
            if (iVar3 != 0x3b9e776a) goto LAB_0017ca70;
            if ((this->features).separate_ds_layout.separateDepthStencilLayouts != 0) {
              bVar7 = image_layout_is_supported(this,piVar15[4]);
              if (!bVar7) goto LAB_0017c810;
              bVar7 = image_layout_is_supported(this,piVar15[5]);
              if (bVar7) goto LAB_0017caac;
            }
          }
          goto LAB_0017ca7a;
        }
        VVar4 = (this->features).dynamic_rendering_local_read.dynamicRenderingLocalRead;
joined_r0x0017c336:
        if (VVar4 == 0) goto LAB_0017ca7a;
        goto LAB_0017caac;
      }
      if (iVar3 != 0x3b9e3cd0) {
        if (iVar3 != 0x3b9e3cd1) goto LAB_0017ca70;
        VVar4 = (this->features).fragment_shading_rate.pipelineFragmentShadingRate;
        goto joined_r0x0017c336;
      }
      if ((this->features).fragment_shading_rate.attachmentFragmentShadingRate == 0)
      goto LAB_0017ca7a;
      if (*(VkAttachmentReference2 **)(piVar15 + 4) == (VkAttachmentReference2 *)0x0)
      goto LAB_0017caac;
      bVar7 = attachment_reference2_is_supported(this,*(VkAttachmentReference2 **)(piVar15 + 4));
      if (bVar7) {
        uVar10 = piVar15[6];
        bVar7 = false;
        if ((((uVar10 == 0) || (uVar14 = piVar15[7], uVar14 == 0)) ||
            (uVar10 < (this->props).fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.
                      width)) ||
           (((this->props).fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.width <
             uVar10 ||
            (uVar14 < (this->props).fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.
                      height)))) goto LAB_0017ca7a;
        if (uVar14 <= (this->props).fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.
                      height) {
          uVar5 = uVar10;
          if (uVar14 < uVar10) {
            uVar5 = uVar14;
            uVar14 = uVar10;
          }
          bVar7 = false;
          if (uVar14 / uVar5 <=
              (this->props).fragment_shading_rate.
              maxFragmentShadingRateAttachmentTexelSizeAspectRatio) goto LAB_0017caac;
        }
      }
      else {
LAB_0017c810:
        bVar7 = false;
      }
    }
LAB_0017cab3:
  } while (bVar7);
  return piVar15 == (int *)0x0;
}

Assistant:

bool FeatureFilter::Impl::pnext_chain_is_supported(const void *pNext) const
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);

		// These are the currently pNext structs which Fossilize serialize.

		switch (base->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			if (!enabled_extensions.count(VK_KHR_MAINTENANCE2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_1)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			if (!enabled_extensions.count(VK_EXT_VERTEX_ATTRIBUTE_DIVISOR_EXTENSION_NAME) &&
			    !enabled_extensions.count(VK_KHR_VERTEX_ATTRIBUTE_DIVISOR_EXTENSION_NAME))
				return false;

			auto *divisor = static_cast<const VkPipelineVertexInputDivisorStateCreateInfoEXT *>(pNext);
			bool use_zero_divisor = false;
			bool use_non_identity_divisor = false;
			uint32_t max_divisor = 0;

			for (uint32_t i = 0; i < divisor->vertexBindingDivisorCount; i++)
			{
				if (divisor->pVertexBindingDivisors[i].divisor != 1)
					use_non_identity_divisor = true;
				if (divisor->pVertexBindingDivisors[i].divisor == 0)
					use_zero_divisor = true;
				max_divisor = (std::max)(max_divisor, divisor->pVertexBindingDivisors[i].divisor);
			}

			if (max_divisor > props.attribute_divisor.maxVertexAttribDivisor)
				return false;
			if (use_zero_divisor && !features.attribute_divisor.vertexAttributeInstanceRateZeroDivisor)
				return false;
			if (use_non_identity_divisor && !features.attribute_divisor.vertexAttributeInstanceRateDivisor)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			auto *clip = static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext);
			if (clip->depthClipEnable && !features.depth_clip.depthClipEnable)
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			if (features.transform_feedback.geometryStreams == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			if (features.multiview.multiview == VK_FALSE)
				return false;

			auto *multiview = static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext);

			for (uint32_t i = 0; i < multiview->subpassCount; i++)
			{
				if (!multiview_mask_is_supported(multiview->pViewMasks[i]))
					return false;
			}

			for (uint32_t i = 0; i < multiview->correlationMaskCount; i++)
			{
				if (!multiview_mask_is_supported(multiview->pCorrelationMasks[i]))
					return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			auto *flags = static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfo *>(pNext);
			VkDescriptorBindingFlagsEXT flag_union = 0;
			for (uint32_t i = 0; i < flags->bindingCount; i++)
				flag_union |= flags->pBindingFlags[i];

			if ((flag_union & VK_DESCRIPTOR_BINDING_UPDATE_UNUSED_WHILE_PENDING_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingUpdateUnusedWhilePending == VK_FALSE)
			{
				return false;
			}

			if ((flag_union & VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingPartiallyBound == VK_FALSE)
			{
				return false;
			}

			if ((flag_union & VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingVariableDescriptorCount == VK_FALSE)
			{
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			if (features.blend_operation_advanced.advancedBlendCoherentOperations == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			if (!enabled_extensions.count(VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			auto *line = static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext);
			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_KHR &&
			    features.line_rasterization.rectangularLines == VK_FALSE)
			{
				return false;
			}

			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_BRESENHAM_KHR &&
			    features.line_rasterization.bresenhamLines == VK_FALSE)
			{
				return false;
			}

			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_SMOOTH_KHR &&
			    features.line_rasterization.smoothLines == VK_FALSE)
			{
				return false;
			}

			if (line->stippledLineEnable == VK_TRUE)
			{
				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_KHR &&
				    features.line_rasterization.stippledRectangularLines == VK_FALSE)
				{
					return false;
				}

				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_BRESENHAM_KHR &&
				    features.line_rasterization.stippledBresenhamLines == VK_FALSE)
				{
					return false;
				}

				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_SMOOTH_KHR &&
				    features.line_rasterization.stippledSmoothLines == VK_FALSE)
				{
					return false;
				}
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			// The details are validated explicitly elsewhere since we need to know the shader create info to deduce correctness.
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			if (features.mutable_descriptor_type.mutableDescriptorType == VK_FALSE)
				return false;

			auto *lists = static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext);
			for (uint32_t i = 0; i < lists->mutableDescriptorTypeListCount; i++)
			{
				for (uint32_t j = 0; j < lists->pMutableDescriptorTypeLists[i].descriptorTypeCount; j++)
				{
					switch (lists->pMutableDescriptorTypeLists[i].pDescriptorTypes[j])
					{
					case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
					case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
					case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
					case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
					case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					case VK_DESCRIPTOR_TYPE_SAMPLER:
						break;

					default:
						// Implementation can theoretically support beyond this (and we'd have to query support),
						// but validate against what is required.
						return false;
					}
				}
			}

			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			if (!features.separate_ds_layout.separateDepthStencilLayouts)
				return false;

			auto *layout = static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext);
			if (!image_layout_is_supported(layout->stencilInitialLayout))
				return false;
			if (!image_layout_is_supported(layout->stencilFinalLayout))
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			if (!features.separate_ds_layout.separateDepthStencilLayouts)
				return false;

			auto *layout = static_cast<const VkAttachmentReferenceStencilLayout *>(pNext);
			if (!image_layout_is_supported(layout->stencilLayout))
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			if (api_version < VK_API_VERSION_1_2 && !enabled_extensions.count(VK_KHR_DEPTH_STENCIL_RESOLVE_EXTENSION_NAME))
				return false;

			auto *resolve = static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext);

			if (!resolve->pDepthStencilResolveAttachment)
				break;

			if (!attachment_reference2_is_supported(*resolve->pDepthStencilResolveAttachment))
				return false;

			if (resolve->depthResolveMode &&
			    (props.ds_resolve.supportedDepthResolveModes & resolve->depthResolveMode) == 0)
				return false;

			if (resolve->stencilResolveMode &&
			    (props.ds_resolve.supportedStencilResolveModes & resolve->stencilResolveMode) == 0)
				return false;

			if (resolve->depthResolveMode != resolve->stencilResolveMode)
			{
				bool use_zero = resolve->depthResolveMode == VK_RESOLVE_MODE_NONE ||
				                resolve->stencilResolveMode == VK_RESOLVE_MODE_NONE;

				auto cond = use_zero ?
				            props.ds_resolve.independentResolveNone :
				            props.ds_resolve.independentResolve;
				if (!cond)
					return false;
			}

			if (resolve->depthResolveMode == VK_RESOLVE_MODE_EXTERNAL_FORMAT_DOWNSAMPLE_ANDROID ||
			    resolve->stencilResolveMode == VK_RESOLVE_MODE_EXTERNAL_FORMAT_DOWNSAMPLE_ANDROID)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			if (!features.fragment_shading_rate.attachmentFragmentShadingRate)
				return false;

			auto *attachment = static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext);

			if (!attachment->pFragmentShadingRateAttachment)
				break;

			if (!attachment_reference2_is_supported(*attachment->pFragmentShadingRateAttachment))
				return false;

			uint32_t width = attachment->shadingRateAttachmentTexelSize.width;
			uint32_t height = attachment->shadingRateAttachmentTexelSize.height;

			if (width == 0 || height == 0)
				return false;

			if (width < props.fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.width)
				return false;
			if (width > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.width)
				return false;
			if (height < props.fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.height)
				return false;
			if (height > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.height)
				return false;

			uint32_t higher = (std::max)(width, height);
			uint32_t lower = (std::min)(width, height);
			uint32_t aspect = higher / lower;
			if (aspect > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSizeAspectRatio)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			if (features.dynamic_rendering.dynamicRendering == VK_FALSE)
				return false;

			auto *info = static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext);

			for (uint32_t i = 0; i < info->colorAttachmentCount; i++)
			{
				if (info->pColorAttachmentFormats[i] != VK_FORMAT_UNDEFINED &&
				    !format_is_supported(info->pColorAttachmentFormats[i], VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT))
				{
					return false;
				}
			}

			if (info->depthAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    !format_is_supported(info->depthAttachmentFormat, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
			{
				return false;
			}

			if (info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    !format_is_supported(info->stencilAttachmentFormat, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
			{
				return false;
			}

			if (info->depthAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    info->depthAttachmentFormat != info->stencilAttachmentFormat)
			{
				return false;
			}

			if (info->viewMask && !multiview_mask_is_supported(info->viewMask))
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			if (!features.color_write_enable.colorWriteEnable)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_PROVOKING_VERTEX_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext);

			if (info->provokingVertexMode == VK_PROVOKING_VERTEX_MODE_LAST_VERTEX_EXT &&
			    !features.provoking_vertex.provokingVertexLast)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_CUSTOM_BORDER_COLOR_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext);

			if (info->format == VK_FORMAT_UNDEFINED &&
			    !features.custom_border_color.customBorderColorWithoutFormat)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			if (!enabled_extensions.count(VK_EXT_SAMPLER_FILTER_MINMAX_EXTENSION_NAME) && !features.vk12.samplerFilterMinmax)
				return false;

			auto *info = static_cast<const VkSamplerReductionModeCreateInfo *>(pNext);
			switch (info->reductionMode)
			{
			case VK_SAMPLER_REDUCTION_MODE_MAX:
			case VK_SAMPLER_REDUCTION_MODE_MIN:
			case VK_SAMPLER_REDUCTION_MODE_WEIGHTED_AVERAGE:
				break;

			default:
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			if (!enabled_extensions.count(VK_KHR_MAINTENANCE_2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_1)
				return false;

			auto *info = static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext);
			for (uint32_t i = 0; i < info->aspectReferenceCount; i++)
				if (!aspect_mask_is_supported(info->pAspectReferences[i].aspectMask))
					return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_DISCARD_RECTANGLES_EXTENSION_NAME))
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			if (!features.synchronization2.synchronization2)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			if (!features.fragment_shading_rate.pipelineFragmentShadingRate)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO:
		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			// Should also validate formats and all sorts of feature bits, but
			// consider that TODO for now.
			// YcbcrConversionCreateInfo is inlined into a VkSamplerCreateInfo when replaying from a Fossilize archive.
			// Normally, it's not a pNext, but we pretend it is to make capture and replay
			// a bit more sane.
			if (!features.ycbcr_conversion.samplerYcbcrConversion)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			if (features.graphics_pipeline_library.graphicsPipelineLibrary == VK_FALSE)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext);
			// If count is 0, this is part of dynamic state, so just ignore it.
			if (!info->sampleLocationsEnable || info->sampleLocationsInfo.sampleLocationsCount == 0)
				break;

			if (info->sampleLocationsInfo.sampleLocationGridSize.width > props.sample_locations.maxSampleLocationGridSize.width ||
			    info->sampleLocationsInfo.sampleLocationGridSize.height > props.sample_locations.maxSampleLocationGridSize.height)
			{
				return false;
			}

			if ((props.sample_locations.sampleLocationSampleCounts & info->sampleLocationsInfo.sampleLocationsPerPixel) == 0)
				return false;

			// Sample positions are clamped by implementation.
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			if (!features.depth_clip_control.depthClipControl)
			{
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			if (enabled_extensions.count(VK_EXT_PIPELINE_ROBUSTNESS_EXTENSION_NAME) == 0)
				return false;
			auto *info = static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext);

			if ((info->storageBuffers != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->images != VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->uniformBuffers != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->vertexInputs != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT) &&
			    features.pipeline_robustness.pipelineRobustness == VK_FALSE)
			{
				return false;
			}

			if (!query)
				return false;

			bool need_robust_image =
					info->images == VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_EXT;
			bool need_robust_image2 =
					info->images == VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_2_EXT;
			bool need_robust_buffer2 =
					info->storageBuffers == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT ||
					info->vertexInputs == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT ||
					info->uniformBuffers == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT;

			// From spec:
			// Any component of the implementation (the loader, any enabled layers, and drivers) must skip over,
			// without processing (other than reading the sType and pNext members)
			// any extending structures in the chain not defined by core versions
			// or extensions supported by that component.
			// I.e. it's safe for us to query the struct, even if the extension is not supported.

			if (need_robust_image)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceImageRobustnessFeaturesEXT robust_image =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT };
				pdf2.pNext = &robust_image;
				query->physical_device_feature_query(&pdf2);
				if (robust_image.robustImageAccess == VK_FALSE)
					return false;
			}

			if (need_robust_image2)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceRobustness2FeaturesEXT robust2 =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
				pdf2.pNext = &robust2;
				query->physical_device_feature_query(&pdf2);
				if (robust2.robustImageAccess2 == VK_FALSE)
					return false;
			}

			if (need_robust_buffer2)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceRobustness2FeaturesEXT robust2 =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
				pdf2.pNext = &robust2;
				query->physical_device_feature_query(&pdf2);
				if (robust2.robustBufferAccess2 == VK_FALSE)
					return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			// Actual flags are validated separately.
			if (features.maintenance5.maintenance5 == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			if (features.subpass_merge_feedback.subpassMergeFeedback == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			if (features.border_color_swizzle.borderColorSwizzle == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			if (features.multisampled_render_to_single_sampled.multisampledRenderToSingleSampled == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			if (enabled_extensions.count(VK_EXT_DEPTH_BIAS_CONTROL_EXTENSION_NAME) == 0)
				return false;

			auto *info = static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext);
			if (info->depthBiasRepresentation == VK_DEPTH_BIAS_REPRESENTATION_LEAST_REPRESENTABLE_VALUE_FORCE_UNORM_EXT &&
			    features.depth_bias_control.leastRepresentableValueForceUnormRepresentation == VK_FALSE)
				return false;

			if (info->depthBiasRepresentation == VK_DEPTH_BIAS_REPRESENTATION_FLOAT_EXT &&
			    features.depth_bias_control.floatRepresentation == VK_FALSE)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			if (features.fragment_density.fragmentDensityMap == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			if (enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME) == 0)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			if (features.depth_clamp_control.depthClampControl == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			if (features.dynamic_rendering_local_read.dynamicRenderingLocalRead == VK_FALSE)
				return false;
			break;
		}

		default:
			LOGE("Unrecognized pNext sType: %u. Treating as unsupported.\n", unsigned(base->sType));
			return false;
		}

		pNext = base->pNext;
	}
	return true;
}